

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void expand_3_i32(TCGContext_conflict9 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t bofs,
                 uint32_t oprsz,_Bool load_dest,
                 _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict9 *fni)

{
  TCGv_i32 arg;
  TCGv_i32 arg_00;
  TCGv_i32 arg_01;
  uint local_44;
  uint32_t i;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGv_i32 t0;
  _Bool load_dest_local;
  uint32_t oprsz_local;
  uint32_t bofs_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg = tcg_temp_new_i32(tcg_ctx);
  arg_00 = tcg_temp_new_i32(tcg_ctx);
  arg_01 = tcg_temp_new_i32(tcg_ctx);
  for (local_44 = 0; local_44 < oprsz; local_44 = local_44 + 4) {
    tcg_gen_ld_i32(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(aofs + local_44));
    tcg_gen_ld_i32(tcg_ctx,arg_00,tcg_ctx->cpu_env,(ulong)(bofs + local_44));
    if (load_dest) {
      tcg_gen_ld_i32(tcg_ctx,arg_01,tcg_ctx->cpu_env,(ulong)(dofs + local_44));
    }
    (*fni)(tcg_ctx,arg_01,arg,arg_00);
    tcg_gen_st_i32(tcg_ctx,arg_01,tcg_ctx->cpu_env,(ulong)(dofs + local_44));
  }
  tcg_temp_free_i32(tcg_ctx,arg_01);
  tcg_temp_free_i32(tcg_ctx,arg_00);
  tcg_temp_free_i32(tcg_ctx,arg);
  return;
}

Assistant:

static void expand_3_i32(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs,
                         uint32_t bofs, uint32_t oprsz, bool load_dest,
                         void (*fni)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32))
{
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
    uint32_t i;

    for (i = 0; i < oprsz; i += 4) {
        tcg_gen_ld_i32(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        tcg_gen_ld_i32(tcg_ctx, t1, tcg_ctx->cpu_env, bofs + i);
        if (load_dest) {
            tcg_gen_ld_i32(tcg_ctx, t2, tcg_ctx->cpu_env, dofs + i);
        }
        fni(tcg_ctx, t2, t0, t1);
        tcg_gen_st_i32(tcg_ctx, t2, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t0);
}